

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O2

void Dau_DsdRemoveBraces_rec(char *pStr,char **p,int *pMatches)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar4 = (byte *)*p;
  if (*pbVar4 != 0x21) goto LAB_00435b98;
  do {
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
LAB_00435b98:
    bVar3 = *pbVar4;
  } while ((byte)(bVar3 - 0x30) < 10 || (byte)(bVar3 + 0xbf) < 6);
  if (bVar3 == 0x3c) {
    bVar3 = 0x3c;
    if (pStr[(long)pMatches[(long)pbVar4 - (long)pStr] + 1] != '{') goto LAB_00435c0c;
    pbVar4 = (byte *)(pStr + (long)pMatches[(long)pbVar4 - (long)pStr] + 1);
    *p = (char *)pbVar4;
    bVar3 = *pbVar4;
  }
  if ((byte)(bVar3 + 0x9f) < 0x1a) {
    return;
  }
  if (((0x3f < bVar3 - 0x3c) || ((0x8000000080000001U >> ((ulong)(bVar3 - 0x3c) & 0x3f) & 1) == 0))
     && (bVar3 != 0x28)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x228,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
  }
LAB_00435c0c:
  if ((uint)bVar3 + (uint)(bVar3 != 0x28) + 1 != (int)pStr[pMatches[(long)pbVar4 - (long)pStr]]) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x219,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
  }
  pbVar5 = (byte *)(pStr + pMatches[(long)pbVar4 - (long)pStr]);
  do {
    pbVar1 = pbVar4 + 1;
    *p = (char *)pbVar1;
    if (pbVar5 <= pbVar1) {
      if (pbVar1 == pbVar5) {
        return;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x225,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
    }
    bVar3 = pbVar4[1];
    Dau_DsdRemoveBraces_rec(pStr,p,pMatches);
    if (bVar3 == 0x21) {
      bVar3 = pbVar4[2];
      pbVar1 = pbVar4 + 2;
LAB_00435c80:
      if ((bVar3 == 0x5b) && (*pbVar5 == 0x5d)) {
LAB_00435c8c:
        cVar2 = **p;
        if ((cVar2 != ')') && (cVar2 != ']')) {
          __assert_fail("**p == \')\' || **p == \']\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x221,"void Dau_DsdRemoveBraces_rec(char *, char **, int *)");
        }
        **p = ' ';
        *pbVar1 = 0x20;
      }
    }
    else {
      bVar3 = *pbVar1;
      if (bVar3 != 0x28) goto LAB_00435c80;
      if (*pbVar5 == 0x29) goto LAB_00435c8c;
    }
    pbVar4 = (byte *)*p;
  } while( true );
}

Assistant:

void Dau_DsdRemoveBraces_rec( char * pStr, char ** p, int * pMatches )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return;
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) 
    {
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            int fCompl = (**p == '!');
            char * pBeg = fCompl ? *p + 1 : *p;
            Dau_DsdRemoveBraces_rec( pStr, p, pMatches );
            if ( (!fCompl && *pBeg == '(' && *q == ')') || (*pBeg == '[' && *q == ']') )
            {
                assert( **p == ')' || **p == ']' );
                *pBeg = **p = ' ';
            }
        }
        assert( *p == q );
        return;
    }
    assert( 0 );
}